

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

char * __thiscall QTreeModel::index(QTreeModel *this,char *__s,int __c)

{
  bool bVar1;
  int iVar2;
  QTreeWidgetItem *pQVar3;
  uint in_ECX;
  QTreeModel *this_00;
  QTreeModel *in_R8;
  
  executePendingSort((QTreeModel *)__s);
  iVar2 = (**(code **)(*(long *)__s + 0x80))(__s);
  if ((-1 < (int)(in_ECX | __c)) && ((int)in_ECX < iVar2)) {
    this_00 = in_R8;
    bVar1 = QModelIndex::isValid((QModelIndex *)in_R8);
    if (bVar1) {
      pQVar3 = item(this_00,(QModelIndex *)in_R8);
    }
    else {
      pQVar3 = *(QTreeWidgetItem **)(__s + 0x10);
    }
    if ((pQVar3 != (QTreeWidgetItem *)0x0) && (__c < (int)(pQVar3->children).d.size)) {
      pQVar3 = QTreeWidgetItem::child(pQVar3,__c);
      if (pQVar3 != (QTreeWidgetItem *)0x0) {
        *(int *)this = __c;
        *(uint *)&this->field_0x4 = in_ECX;
        *(QTreeWidgetItem **)&this->field_0x8 = pQVar3;
        this->rootItem = (QTreeWidgetItem *)__s;
        return (char *)this;
      }
      *(undefined8 *)this = 0xffffffffffffffff;
      *(undefined8 *)&this->field_0x8 = 0;
      this->rootItem = (QTreeWidgetItem *)0x0;
      return (char *)this;
    }
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  this->rootItem = (QTreeWidgetItem *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex QTreeModel::index(int row, int column, const QModelIndex &parent) const
{
    executePendingSort();

    int c = columnCount(parent);
    if (row < 0 || column < 0 || column >= c)
        return QModelIndex();

    QTreeWidgetItem *parentItem = parent.isValid() ? item(parent) : rootItem;
    if (parentItem && row < parentItem->childCount()) {
        QTreeWidgetItem *itm = parentItem->child(row);
        if (itm)
            return createIndex(row, column, itm);
        return QModelIndex();
    }

    return QModelIndex();
}